

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_io.cc
# Opt level: O1

void __thiscall
gimage::RAWImageIO::load
          (RAWImageIO *this,ImageU8 *image,char *name,int ds,long x,long y,long w,long h)

{
  int *piVar1;
  size_t sVar2;
  byte bVar3;
  int iVar4;
  void *__s;
  void *__s_00;
  IOException *pIVar5;
  long *plVar6;
  size_type *psVar7;
  size_t __n;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  bool msbfirst;
  long height;
  int type;
  string filename;
  ifstream in;
  long *in_stack_fffffffffffffcc8;
  allocator local_329;
  long local_328;
  undefined1 local_319;
  long local_318;
  long local_310;
  long local_308;
  ulong local_300;
  long local_2f8;
  int local_2ec;
  size_t local_2e8;
  long local_2e0;
  long local_2d8;
  long local_2d0;
  ImageU8 *local_2c8;
  long local_2c0;
  long local_2b8;
  long local_2b0;
  long local_2a8;
  ulong local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  undefined1 *local_278;
  undefined8 local_270;
  undefined1 local_268 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  string local_238;
  byte *local_218;
  byte *local_210;
  
  local_278 = local_268;
  local_270 = 0;
  local_268[0] = 0;
  local_310 = x;
  local_308 = y;
  iVar4 = (*(this->super_BasicImageIO)._vptr_BasicImageIO[3])(this,name,1);
  if ((char)iVar4 == '\0') {
    pIVar5 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_258,name,&local_329);
    std::operator+(&local_298,"Can only load RAW image (",&local_258);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_298);
    local_238._M_dataplus._M_p = (pointer)*plVar6;
    psVar7 = (size_type *)(plVar6 + 2);
    if ((size_type *)local_238._M_dataplus._M_p == psVar7) {
      local_238.field_2._M_allocated_capacity = *psVar7;
      local_238.field_2._8_8_ = plVar6[3];
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    }
    else {
      local_238.field_2._M_allocated_capacity = *psVar7;
    }
    local_238._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    gutil::IOException::IOException(pIVar5,&local_238);
    __cxa_throw(pIVar5,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  (anonymous_namespace)::readRAWHeader_abi_cxx11_
            (&local_238,(_anonymous_namespace_ *)name,(char *)&local_2ec,(int *)&local_319,
             (bool *)&local_328,&local_318,in_stack_fffffffffffffcc8);
  std::__cxx11::string::operator=((string *)&local_278,(string *)&local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  if (1 < local_2ec) {
    pIVar5 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_258,name,&local_329);
    std::operator+(&local_298,"A 16 bit image cannot be loaded as 8 bit image (",&local_258);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_298);
    local_238._M_dataplus._M_p = (pointer)*plVar6;
    psVar7 = (size_type *)(plVar6 + 2);
    if ((size_type *)local_238._M_dataplus._M_p == psVar7) {
      local_238.field_2._M_allocated_capacity = *psVar7;
      local_238.field_2._8_8_ = plVar6[3];
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    }
    else {
      local_238.field_2._M_allocated_capacity = *psVar7;
    }
    local_238._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    gutil::IOException::IOException(pIVar5,&local_238);
    __cxa_throw(pIVar5,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  uVar8 = 1;
  if (1 < ds) {
    uVar8 = ds;
  }
  if (w < 0) {
    w = (long)(local_328 + (ulong)uVar8 + -1) / (long)(ulong)uVar8;
  }
  if (h < 0) {
    h = (long)(local_318 + (ulong)uVar8 + -1) / (long)(ulong)uVar8;
  }
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setSize(image,w,h,1);
  sVar2 = image->n;
  __n = -sVar2;
  if (0 < (long)sVar2) {
    __n = sVar2;
  }
  memset(image->pixel,0,__n);
  std::ifstream::ifstream(&local_238);
  lVar9 = *(long *)(local_238._M_dataplus._M_p + -0x18);
  *(undefined4 *)((long)&local_238.field_2 + lVar9 + 0xc) = 7;
  std::ios::clear((int)&stack0xfffffffffffffcc8 + (int)lVar9 + 0x100);
  std::ifstream::open((char *)&local_238,(_Ios_Openmode)local_278);
  if ((((ds < 2) && (local_308 == 0 && local_310 == 0)) && (w == local_328)) && (h == local_318)) {
    if (0 < local_318) {
      lVar9 = 0;
      do {
        if (0 < local_328) {
          lVar13 = 0;
          do {
            if (local_218 < local_210) {
              bVar3 = *local_218;
              local_218 = local_218 + 1;
            }
            else {
              bVar3 = (**(code **)(local_238.field_2._M_allocated_capacity + 0x50))
                                (&local_238.field_2);
            }
            (*image->img)[lVar9][lVar13] = bVar3;
            lVar13 = lVar13 + 1;
          } while (lVar13 < local_328);
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < local_318);
    }
  }
  else {
    uVar10 = w * 4;
    __s = operator_new(uVar10);
    if (w != 0) {
      memset(__s,0,uVar10);
    }
    local_2e8 = uVar10;
    __s_00 = operator_new(uVar10);
    if (w != 0) {
      memset(__s_00,0,local_2e8);
    }
    lVar9 = 0;
    if (-local_308 != 0 && local_308 < 1) {
      lVar9 = -local_308;
    }
    if (lVar9 < h) {
      uVar10 = (ulong)uVar8;
      local_2b0 = 0;
      if (0 < local_310) {
        local_2b0 = local_310;
      }
      local_2b0 = local_2b0 * uVar10;
      local_2f8 = -local_310;
      if (-local_310 == 0 || 0 < local_310) {
        local_2f8 = 0;
      }
      local_2b8 = (local_310 + local_2f8) * uVar10;
      local_2d8 = (local_310 + local_2f8 + -1) * uVar10;
      local_300 = uVar10;
      local_2e0 = w;
      local_2d0 = h;
      local_2c8 = image;
      do {
        sVar2 = local_2e8;
        local_2a8 = (lVar9 + local_308) * uVar10;
        if (local_318 <= local_2a8) break;
        local_2c0 = lVar9;
        if (w != 0) {
          memset(__s,0,local_2e8);
          memset(__s_00,0,sVar2);
          uVar10 = local_300;
        }
        uVar12 = 0;
        do {
          if (local_318 <= (long)(uVar12 + local_2a8)) break;
          local_2a0 = uVar12;
          std::istream::seekg(&local_238,(uVar12 + local_2a8) * local_328 + local_2b0,0);
          lVar9 = local_310;
          lVar13 = local_2b8;
          uVar10 = local_300;
          lVar11 = local_2f8;
          if (local_2f8 < w) {
            do {
              uVar12 = uVar10;
              lVar14 = lVar13;
              if (local_328 <= (long)((lVar9 + lVar11) * uVar10)) break;
              do {
                if (local_328 <= lVar14) break;
                if (local_218 < local_210) {
                  bVar3 = *local_218;
                  local_218 = local_218 + 1;
                }
                else {
                  bVar3 = (**(code **)(local_238.field_2._M_allocated_capacity + 0x50))
                                    (&local_238.field_2);
                  lVar9 = local_310;
                  uVar10 = local_300;
                }
                piVar1 = (int *)((long)__s + lVar11 * 4);
                *piVar1 = *piVar1 + (uint)bVar3;
                piVar1 = (int *)((long)__s_00 + lVar11 * 4);
                *piVar1 = *piVar1 + 1;
                lVar14 = lVar14 + 1;
                uVar12 = uVar12 - 1;
              } while (uVar12 != 0);
              lVar11 = lVar11 + 1;
              lVar13 = lVar13 + uVar10;
            } while (lVar11 != local_2e0);
          }
          uVar12 = local_2a0 + 1;
          w = local_2e0;
        } while (uVar12 != uVar10);
        lVar9 = local_2d8;
        lVar13 = local_2f8;
        if (local_2f8 < w) {
          do {
            lVar9 = lVar9 + uVar10;
            if (local_328 <= lVar9) break;
            iVar4 = *(int *)((long)__s_00 + lVar13 * 4);
            if (0 < iVar4) {
              (*local_2c8->img)[local_2c0][lVar13] =
                   (uchar)(*(int *)((long)__s + lVar13 * 4) / iVar4);
            }
            lVar13 = lVar13 + 1;
          } while (w != lVar13);
        }
        lVar9 = local_2c0 + 1;
      } while (lVar9 != local_2d0);
    }
    operator_delete(__s_00);
    operator_delete(__s);
  }
  std::ifstream::close();
  std::ifstream::~ifstream(&local_238);
  if (local_278 != local_268) {
    operator_delete(local_278);
  }
  return;
}

Assistant:

void RAWImageIO::load(ImageU8 &image, const char *name, int ds, long x, long y,
                      long w, long h) const
{
  std::string filename;
  long   width, height;
  int    type;
  bool   msbfirst;

  if (!handlesFile(name, true))
  {
    throw gutil::IOException("Can only load RAW image ("+std::string(name)+")");
  }

  filename=readRAWHeader(name, type, msbfirst, width, height);

  if (type > 1)
  {
    throw gutil::IOException("A 16 bit image cannot be loaded as 8 bit image ("+std::string(name)+")");
  }

  ds=std::max(1, ds);

  if (w < 0)
  {
    w=(width+ds-1)/ds;
  }

  if (h < 0)
  {
    h=(height+ds-1)/ds;
  }

  image.setSize(w, h, 1);
  image.clear();

  try
  {
    std::ifstream in;
    in.exceptions(std::ios_base::failbit | std::ios_base::badbit | std::ios_base::eofbit);
    in.open(filename.c_str(), std::ios::binary);

    // load downscaled part?

    if (ds > 1 || x != 0 || y != 0 || w != width || h != height)
    {
      std::valarray<ImageU8::work_t> vline(0, w);
      std::valarray<int> nline(0, w);

      for (long k=std::max(0l, -y); k<h && (y+k)*ds<height; k++)
      {
        // load downscaled line

        vline=0;
        nline=0;

        for (long kk=0; kk<ds && kk+(y+k)*ds<height; kk++)
        {
          in.seekg(static_cast<std::streamoff>((y+k)*ds+kk)*width+
                   static_cast<std::streamoff>(std::max(0l, x))*ds);

          std::streambuf *sb=in.rdbuf();

          long j=std::max(0l, -x);

          for (long i=std::max(0l, -x); i<w && (x+i)*ds<width; i++)
          {
            for (int ii=0; ii<ds && (x+i)*ds+ii<width; ii++)
            {
              ImageU8::store_t v=static_cast<ImageU8::store_t>(sb->sbumpc());

              if (image.isValidS(v))
              {
                vline[j]+=v;
                nline[j]++;
              }
            }

            j++;
          }
        }

        // store line into image

        long j=std::max(0l, -x);

        for (long i=std::max(0l, -x); i<w && (x+i)*ds<width; i++)
        {
          if (nline[j] > 0)
          {
            image.set(i, k, 0, static_cast<ImageU8::store_t>(vline[j]/nline[j]));
          }

          j++;
        }
      }
    }
    else // load whole image
    {
      std::streambuf *sb=in.rdbuf();

      for (long k=0; k<height; k++)
      {
        for (long i=0; i<width; i++)
        {
          image.set(i, k, 0, static_cast<ImageU8::store_t>(sb->sbumpc()));
        }
      }
    }

    in.close();
  }
  catch (const std::ios_base::failure &ex)
  {
    throw gutil::IOException(ex.what());
  }
}